

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImRect IVar4;
  
  switch(rect_type) {
  case 0:
    IVar2 = window->Pos;
    IVar3 = window->Size;
    goto LAB_0014538c;
  case 1:
    return window->OuterRectClipped;
  case 2:
    return window->InnerRect;
  case 3:
    return window->InnerClipRect;
  case 4:
    return window->WorkRect;
  case 5:
    IVar3 = window->ContentSize;
    break;
  case 6:
    IVar3 = window->ContentSizeIdeal;
    break;
  case 7:
    return window->ContentRegionRect;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x3057,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  IVar1 = (window->InnerRect).Min;
  IVar2.x = (IVar1.x - (window->Scroll).x) + (window->WindowPadding).x;
  IVar2.y = (IVar1.y - (window->Scroll).y) + (window->WindowPadding).y;
LAB_0014538c:
  IVar4.Max.x = IVar3.x + IVar2.x;
  IVar4.Max.y = IVar3.y + IVar2.y;
  IVar4.Min = IVar2;
  return IVar4;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }